

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * read_input(string *__return_storage_ptr__,string *input_filename)

{
  ifstream input;
  size_type *local_240;
  size_type local_238;
  size_type local_230;
  undefined8 uStack_228;
  long local_220 [29];
  undefined8 auStack_138 [36];
  
  std::ifstream::ifstream((string *)local_220);
  std::ifstream::open((string *)local_220,(_Ios_Openmode)input_filename);
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&local_240,
             *(undefined8 *)((long)auStack_138 + *(long *)(local_220[0] + -0x18)),0xffffffff,0,
             0xffffffff);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_240 == &local_230) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_230;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_228;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_240;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_230;
  }
  __return_storage_ptr__->_M_string_length = local_238;
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

string read_input(std::string& input_filename) {
  ifstream input;
  input.open(input_filename);
  auto in = std::string(istreambuf_iterator<char>(input),
                        istreambuf_iterator<char>());
  return std::move(in);
}